

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O3

void __thiscall
kratos::SystemVerilogCodeGen::stmt_code(SystemVerilogCodeGen *this,CombinationalStmtBlock *stmt)

{
  ulong uVar1;
  char *pcVar2;
  undefined1 local_48 [8];
  string keyword;
  
  uVar1 = (ulong)(byte)(stmt->super_StmtBlock).field_0xdc;
  pcVar2 = "always_comb";
  if (uVar1 != 0) {
    pcVar2 = "always";
  }
  local_48 = (undefined1  [8])&keyword._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_48,pcVar2,pcVar2 + (uVar1 ^ 1) * 5 + 6);
  block_code(this,(string *)local_48,&stmt->super_StmtBlock);
  if (local_48 != (undefined1  [8])&keyword._M_string_length) {
    operator_delete((void *)local_48,keyword._M_string_length + 1);
  }
  return;
}

Assistant:

void SystemVerilogCodeGen::stmt_code(CombinationalStmtBlock* stmt) {
    std::string keyword = stmt->is_general_purpose() ? "always" : "always_comb";
    block_code(keyword, stmt);
}